

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O2

bool __thiscall QuickConnection::SendPayload(QuickConnection *this,void *data,uint16_t data_len)

{
  unsigned_short value;
  uint16_t sequence_number;
  RingBuffer<QuickPacket> *pRVar1;
  uint8_t *data_00;
  bool bVar2;
  int iVar3;
  QuickPacket *pQVar4;
  undefined4 extraout_var;
  int iVar5;
  
  value = ((this->_unacked_packet_map)._M_t.
           super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
           .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl)->
          _least_unack_sequence_number;
  bVar2 = quic::IsNewer<unsigned_short>(value,this->_sequence_number);
  if ((bVar2 && value != this->_sequence_number) ||
     (pQVar4 = quic::QuicUnackedPacketMap::packet
                         ((this->_unacked_packet_map)._M_t.
                          super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
                          .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl,
                          this->_sequence_number), pQVar4 != (QuickPacket *)0x0)) {
    return false;
  }
  pRVar1 = (this->_wait_send_packets)._M_t.
           super___uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_RingBuffer<QuickPacket>_*,_std::default_delete<RingBuffer<QuickPacket>_>_>
           .super__Head_base<0UL,_RingBuffer<QuickPacket>_*,_false>._M_head_impl;
  pQVar4 = (QuickPacket *)0x0;
  if (pRVar1->_capacity != (uint)(pRVar1->_packet_count).super___atomic_base<unsigned_short>._M_i) {
    pQVar4 = pRVar1->_buffer + pRVar1->_write_index;
  }
  if (0x546 < data_len) {
    return false;
  }
  if (pQVar4 == (QuickPacket *)0x0) {
    return false;
  }
  data_00 = (this->_send_buf)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  *data_00 = '\x06';
  *(uint32_t *)(data_00 + 1) = this->_session_id;
  *(uint16_t *)(data_00 + 7) = this->_sequence_number;
  memcpy(data_00 + 0x11,data,(ulong)data_len);
  sequence_number = this->_sequence_number;
  this->_sequence_number = sequence_number + 1;
  iVar3 = (*((this->_clock)._M_t.
             super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
             super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
             super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])();
  QuickPacket::WriteData
            (pQVar4,sequence_number,data_00,data_len + 0x11,CONCAT44(extraout_var,iVar3));
  pRVar1 = (this->_wait_send_packets)._M_t.
           super___uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_RingBuffer<QuickPacket>_*,_std::default_delete<RingBuffer<QuickPacket>_>_>
           .super__Head_base<0UL,_RingBuffer<QuickPacket>_*,_false>._M_head_impl;
  iVar5 = pRVar1->_write_index + 1;
  iVar3 = 0;
  if (iVar5 < pRVar1->_capacity) {
    iVar3 = iVar5;
  }
  pRVar1->_write_index = (uint16_t)iVar3;
  LOCK();
  (pRVar1->_packet_count).super___atomic_base<unsigned_short>._M_i =
       (pRVar1->_packet_count).super___atomic_base<unsigned_short>._M_i + 1;
  UNLOCK();
  return true;
}

Assistant:

bool QuickConnection::SendPayload(const void* data, uint16_t data_len)
{
	// �������� GetLeastUnackedSequenceNumberӦ����Ҫ�����ģ����Ӳ������õ���sequnce_number���жϲ����в���Ӱ�죬
	// Ϊ������Ч�ʣ���û��Ҫ������
	uint16_t least_unack_sequence_number = _unacked_packet_map->GetLeastUnackedSequenceNumber();
	if (quic::IsNewer(least_unack_sequence_number, _sequence_number) && least_unack_sequence_number != _sequence_number) {
		return false;
	}
	// ����_sequence_number�Ѿ��������ڵȴ�ack����ô�Ͳ������ٰ���ͬsequence number�İ����뵽�������С�
	// ������������ͬ��sequence number����Ӧ��ͬ�İ���ԭ������uint16_t�ڸ��ٷ��͵������£��ܶ�ʱ���ھͻᷢ������
	if (_unacked_packet_map->packet(_sequence_number) != nullptr)
		return false;

	auto p = _wait_send_packets->GetWriteablePacket();
	if (p == nullptr)
		return false;
	if (data_len > 1350)
		return false;
	QuickPayload *payload = (QuickPayload*)_send_buf.get();
	uint16_t pkt_len = sizeof(QuickPayload) - 1 + data_len;
	payload->msg_id = QUICK_MSG_PAYLOAD;
	payload->session_id = _session_id;
	payload->sequence_number = _sequence_number;
	memcpy(payload->payload, data, data_len);
	p->WriteData(_sequence_number++, (uint8_t*)payload, pkt_len, _clock->Now().ToDebuggingValue());
	_wait_send_packets->WritePacket();
	// ���ﲻ��Ҫ����Wakup�����������������ٶ�
//	_thread->WakeUp(this);

	
	return true;
}